

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void skewed_starvation(size_t W)

{
  uint uVar1;
  Executor *this;
  Task *rhs;
  Taskflow *this_00;
  undefined1 *__stat_loc;
  FlowBuilder *in_RDI;
  size_t w;
  Task right;
  Task left;
  Task parent;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> count;
  atomic<unsigned_long> stop;
  Executor executor;
  Taskflow taskflow;
  string *in_stack_fffffffffffffb18;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffb20;
  Task *in_stack_fffffffffffffb28;
  allocator<char> *repeat;
  Taskflow *in_stack_fffffffffffffb30;
  Executor *in_stack_fffffffffffffb38;
  Taskflow *in_stack_fffffffffffffb40;
  allocator<char> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  anon_class_48_6_073ee0c7 *c;
  FlowBuilder *this_01;
  __basic_future<void> local_488 [2];
  allocator<char> local_461;
  string local_460 [32];
  undefined1 *local_440;
  FlowBuilder **local_438;
  undefined1 *local_430;
  anon_class_48_6_073ee0c7 *local_428;
  string local_418 [32];
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  string local_3d0 [48];
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [32];
  string local_358 [32];
  FlowBuilder *local_338;
  undefined1 *local_330;
  anon_class_48_6_073ee0c7 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  FlowBuilder *local_300;
  Task local_2f8;
  Task local_2f0;
  undefined1 local_2e1 [33];
  anon_class_48_6_073ee0c7 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  Task local_2a0;
  anon_class_48_6_073ee0c7 local_298;
  undefined1 local_260 [40];
  undefined1 local_238 [8];
  undefined1 local_230 [40];
  undefined1 local_208 [512];
  FlowBuilder *local_8;
  
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb40);
  this_01 = local_8;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x119905);
  std::mutex::mutex((mutex *)0x119912);
  c = &local_298;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x119924);
  local_2b8 = local_238;
  local_2b0 = local_230;
  local_2c0 = c;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:513:38),_nullptr>
            (this_01,(anon_class_24_3_f686a84c *)c);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)c,(char *)__lhs,
             in_stack_fffffffffffffb50);
  this = (Executor *)tf::Task::name((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Task::Task(&local_2a0,(Task *)this);
  std::__cxx11::string::~string((string *)(local_2e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e1);
  tf::Task::Task(&local_2f0);
  tf::Task::Task(&local_2f8);
  for (local_300 = (FlowBuilder *)0x0; local_300 < local_8;
      local_300 = (FlowBuilder *)((long)&local_300->_graph + 1)) {
    local_338 = local_300;
    local_330 = local_260;
    local_328 = &local_298;
    local_320 = local_208;
    local_318 = local_238;
    local_310 = local_230;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:522:30),_nullptr>
              (this_01,c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)c,(char *)__lhs,
               (allocator<char> *)this);
    std::__cxx11::to_string((unsigned_long)__lhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    rhs = tf::Task::name((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    tf::Task::operator=(&local_2f8,rhs);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator(&local_379);
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:539:29),_nullptr>
              (this_01,(anon_class_1_0_00000001 *)c);
    in_stack_fffffffffffffb38 = (Executor *)&stack0xfffffffffffffc0f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)c,(char *)__lhs,
               (allocator<char> *)this);
    std::__cxx11::to_string((unsigned_long)__lhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    in_stack_fffffffffffffb30 =
         (Taskflow *)tf::Task::name((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    tf::Task::operator=(&local_2f0,(Task *)in_stack_fffffffffffffb30);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc0f);
    uVar1 = rand();
    if ((uVar1 & 1) == 0) {
      tf::Task::precede<tf::Task&,tf::Task&>
                ((Task *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (Task *)in_stack_fffffffffffffb20);
    }
    else {
      tf::Task::precede<tf::Task&,tf::Task&>
                ((Task *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (Task *)in_stack_fffffffffffffb20);
    }
    tf::Task::operator=(&local_2a0,&local_2f0);
  }
  local_440 = local_238;
  local_438 = &local_8;
  local_430 = local_230;
  local_428 = &local_298;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:554:27),_nullptr>
            (this_01,(anon_class_32_4_5922fbb9 *)c);
  repeat = &local_461;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)c,(char *)__lhs,
             (allocator<char> *)this);
  this_00 = (Taskflow *)tf::Task::name((Task *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  tf::Task::operator=(&local_2f0,(Task *)this_00);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  tf::Task::precede<tf::Task&>((Task *)this_00,(Task *)in_stack_fffffffffffffb18);
  __stat_loc = local_208;
  tf::Executor::run_n(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,(size_t)repeat);
  std::__basic_future<void>::wait(local_488,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)this_00);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x119fae);
  tf::Executor::~Executor(this);
  tf::Taskflow::~Taskflow(this_00);
  return;
}

Assistant:

void skewed_starvation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  tf::Task parent = taskflow.emplace([&](){ 
    set.clear();
    count.store(0, std::memory_order_relaxed);
    stop.store(false, std::memory_order_relaxed);
  }).name("root");

  tf::Task left, right;

  for(size_t w=0; w<W; w++) {
    right = taskflow.emplace([&, w](){
      if(w) {
        // record the worker
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }

        count.fetch_add(1, std::memory_order_release);

        // block the worker
        while(stop.load(std::memory_order_relaxed) == false) {
          std::this_thread::yield();
        }
      }
    }).name(std::string("right-") + std::to_string(w));

    left = taskflow.emplace([&](){
      std::this_thread::yield();
    }).name(std::string("left-") + std::to_string(w));
    
    // we want to remove the effect of parent stealing
    if(rand() & 1) {
      parent.precede(left, right);
    }
    else {
      parent.precede(right, left);
    }

    parent = left;
  }

  left = taskflow.emplace([&](){
    // wait for the other W-1 workers to block
    while(count.load(std::memory_order_acquire) + 1 != W) {
      std::this_thread::yield();
    }
    stop.store(true, std::memory_order_relaxed);

    REQUIRE(set.size() + 1 == W);
  }).name("stop");

  parent.precede(left);

  //taskflow.dump(std::cout);

  executor.run_n(taskflow, 1024).wait();
}